

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O2

int __thiscall
jrtplib::
RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
::DeleteCurrentElement
          (RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
           *this)

{
  HashElement *mgr;
  HashElement *pHVar1;
  HashElement *pHVar2;
  HashElement *pHVar3;
  
  mgr = this->curhashelem;
  if (mgr == (HashElement *)0x0) {
    return -7;
  }
  pHVar3 = mgr->hashprev;
  pHVar1 = mgr->hashnext;
  if (pHVar3 == (HashElement *)0x0) {
    this->table[mgr->hashindex] = pHVar1;
    if (pHVar1 == (HashElement *)0x0) goto LAB_0012c05c;
    pHVar3 = (HashElement *)0x0;
  }
  else {
    pHVar3->hashnext = pHVar1;
    if (pHVar1 == (HashElement *)0x0) goto LAB_0012c05c;
  }
  pHVar1->hashprev = pHVar3;
LAB_0012c05c:
  pHVar3 = this->curhashelem;
  pHVar1 = pHVar3->listprev;
  pHVar2 = pHVar3->listnext;
  if (pHVar1 == (HashElement *)0x0) {
    this->firsthashelem = pHVar2;
    if (pHVar2 == (HashElement *)0x0) {
      this->lasthashelem = (HashElement *)0x0;
    }
    else {
      pHVar2->listprev = (HashElement *)0x0;
    }
  }
  else {
    pHVar1->listnext = pHVar2;
    if (pHVar2 == (HashElement *)0x0) {
      this->lasthashelem = pHVar1;
    }
    else {
      pHVar2->listprev = pHVar1;
    }
  }
  RTPDelete<jrtplib::RTPHashTable<jrtplib::RTPIPv6Destination_const,jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,8317>::HashElement>
            ((jrtplib *)pHVar3,(HashElement *)(this->super_RTPMemoryObject).mgr,
             (RTPMemoryManager *)mgr);
  this->curhashelem = pHVar2;
  return 0;
}

Assistant:

inline int RTPHashTable<Element,GetIndex,hashsize>::DeleteCurrentElement()
{
	if (curhashelem)
	{
		HashElement *tmp1,*tmp2;
		int index;
		
		// First, relink elements in current hash bucket
		
		index = curhashelem->GetHashIndex();
		tmp1 = curhashelem->hashprev;
		tmp2 = curhashelem->hashnext;
		if (tmp1 == 0) // no previous element in hash bucket
		{
			table[index] = tmp2;
			if (tmp2 != 0)
				tmp2->hashprev = 0;
		}
		else // there is a previous element in the hash bucket
		{
			tmp1->hashnext = tmp2;
			if (tmp2 != 0)
				tmp2->hashprev = tmp1;
		}

		// Relink elements in list
		
		tmp1 = curhashelem->listprev;
		tmp2 = curhashelem->listnext;
		if (tmp1 == 0) // curhashelem is first in list
		{
			firsthashelem = tmp2;
			if (tmp2 != 0)
				tmp2->listprev = 0;
			else // curhashelem is also last in list
				lasthashelem = 0;	
		}
		else
		{
			tmp1->listnext = tmp2;
			if (tmp2 != 0)
				tmp2->listprev = tmp1;
			else // curhashelem is last in list
				lasthashelem = tmp1;
		}
		
		// finally, with everything being relinked, we can delete curhashelem
		RTPDelete(curhashelem,GetMemoryManager());
		curhashelem = tmp2; // Set to next element in the list
	}
	else
		return ERR_RTP_HASHTABLE_NOCURRENTELEMENT;
	return 0;
}